

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealVect.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *ostr,RealVect *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"(",1);
  poVar1 = std::ostream::_M_insert<double>(p->vect[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(p->vect[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(p->vect[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return ostr;
}

Assistant:

std::ostream&
  operator<< (std::ostream& ostr, const RealVect& p)
  {
    ostr << "(" << AMREX_D_TERM ( p[0] ,<< "," << p[1], << "," << p[2]) << ")" ;
    return ostr;
  }